

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void DoVerticalFilter_SSE2
               (uint8_t *in,int width,int height,int stride,int row,int num_rows,uint8_t *out)

{
  int in_ECX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *in_stack_00000008;
  int last_row;
  size_t start_offset;
  int local_18;
  uint8_t *local_8;
  
  local_8 = (uint8_t *)(in_R8D * in_ECX + in_RDI);
  in_stack_00000008 = (uint8_t *)((long)(in_R8D * in_ECX) + (long)in_stack_00000008);
  local_18 = in_R8D;
  if (in_R8D == 0) {
    *in_stack_00000008 = *local_8;
    PredictLineLeft_SSE2(local_8 + 1,in_stack_00000008 + 1,in_ESI + -1);
    local_18 = 1;
    local_8 = local_8 + in_ECX;
    in_stack_00000008 = in_stack_00000008 + in_ECX;
  }
  for (; local_18 < in_R8D + in_R9D; local_18 = local_18 + 1) {
    PredictLineTop_SSE2(local_8,local_8 + -(long)in_ECX,in_stack_00000008,in_ESI);
    local_8 = local_8 + in_ECX;
    in_stack_00000008 = in_stack_00000008 + in_ECX;
  }
  return;
}

Assistant:

static WEBP_INLINE void DoVerticalFilter_SSE2(const uint8_t* in,
                                              int width, int height, int stride,
                                              int row, int num_rows,
                                              uint8_t* out) {
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;

  if (row == 0) {
    // Very first top-left pixel is copied.
    out[0] = in[0];
    // Rest of top scan-line is left-predicted.
    PredictLineLeft_SSE2(in + 1, out + 1, width - 1);
    row = 1;
    in += stride;
    out += stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    PredictLineTop_SSE2(in, in - stride, out, width);
    ++row;
    in += stride;
    out += stride;
  }
}